

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O2

Sle_Man_t * Sle_ManAlloc(Gia_Man_t *pGia,int nLevels,int fVerbose)

{
  int iVar1;
  Sle_Man_t *pSVar2;
  Vec_Bit_t *vMask;
  Vec_Int_t *vCuts;
  Vec_Wec_t *pVVar3;
  Vec_Int_t *pVVar4;
  
  pSVar2 = (Sle_Man_t *)calloc(1,0xa0);
  pSVar2->pGia = pGia;
  pSVar2->fVerbose = fVerbose;
  vMask = Sle_ManInternalNodeMask(pGia);
  pSVar2->vMask = vMask;
  vCuts = Sle_ManComputeCuts(pGia,4,fVerbose);
  pSVar2->vCuts = vCuts;
  pVVar3 = Sle_ManCollectCutFanins(pGia,vCuts,vMask);
  pSVar2->vCutFanins = pVVar3;
  pVVar3 = Vec_WecStart(pGia->nObjs);
  pSVar2->vFanoutEdges = pVVar3;
  pVVar3 = Vec_WecAlloc(100);
  pSVar2->vEdgeCuts = pVVar3;
  pVVar4 = Vec_IntStartFull(pGia->nObjs);
  pSVar2->vObjMap = pVVar4;
  pVVar4 = Vec_IntStartFull(pGia->nObjs);
  pSVar2->vCutFirst = pVVar4;
  pVVar4 = Vec_IntStartFull(pGia->nObjs);
  pSVar2->vEdgeFirst = pVVar4;
  pVVar4 = Vec_IntStartFull(pGia->nObjs);
  pSVar2->vDelayFirst = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vPolars = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vLits = pVVar4;
  iVar1 = Sle_ManComputeDelay(pGia,vCuts);
  pSVar2->nLevels = iVar1;
  return pSVar2;
}

Assistant:

Sle_Man_t * Sle_ManAlloc( Gia_Man_t * pGia, int nLevels, int fVerbose )
{
    Sle_Man_t * p   = ABC_CALLOC( Sle_Man_t, 1 );
    p->pGia         = pGia;
    p->nLevels      = nLevels;
    p->fVerbose     = fVerbose;
    p->vMask        = Sle_ManInternalNodeMask( pGia );
    p->vCuts        = Sle_ManComputeCuts( pGia, 4, fVerbose );
    p->vCutFanins   = Sle_ManCollectCutFanins( pGia, p->vCuts, p->vMask );
    p->vFanoutEdges = Vec_WecStart( Gia_ManObjNum(pGia) );
    p->vEdgeCuts    = Vec_WecAlloc( 100 );
    p->vObjMap      = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vCutFirst    = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vEdgeFirst   = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vDelayFirst  = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vPolars      = Vec_IntAlloc( 100 );
    p->vLits        = Vec_IntAlloc( 100 );
    p->nLevels      = Sle_ManComputeDelay( pGia, p->vCuts );
    return p;
}